

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O2

void pzshape::TPZShapeCube::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pdVar5 = pt->fStore;
  dVar9 = (1.0 - *pdVar5) * 0.5;
  dVar10 = (1.0 - pdVar5[1]) * 0.5;
  dVar6 = (*pdVar5 + 1.0) * 0.5;
  dVar8 = (pdVar5[1] + 1.0) * 0.5;
  dVar11 = (1.0 - pdVar5[2]) * 0.5;
  dVar7 = (pdVar5[2] + 1.0) * 0.5;
  dVar1 = dVar9 * dVar10;
  pdVar5 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar5 = dVar1 * dVar11;
  dVar2 = dVar6 * dVar10;
  pdVar5 = TPZFMatrix<double>::operator()(phi,1,0);
  *pdVar5 = dVar2 * dVar11;
  dVar3 = dVar6 * dVar8;
  pdVar5 = TPZFMatrix<double>::operator()(phi,2,0);
  *pdVar5 = dVar3 * dVar11;
  dVar4 = dVar9 * dVar8;
  pdVar5 = TPZFMatrix<double>::operator()(phi,3,0);
  *pdVar5 = dVar4 * dVar11;
  pdVar5 = TPZFMatrix<double>::operator()(phi,4,0);
  *pdVar5 = dVar1 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(phi,5,0);
  *pdVar5 = dVar2 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(phi,6,0);
  *pdVar5 = dVar3 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(phi,7,0);
  *pdVar5 = dVar4 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,0);
  *pdVar5 = dVar10 * -0.5 * dVar11;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,0);
  *pdVar5 = dVar9 * -0.5 * dVar11;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,2,0);
  *pdVar5 = dVar1 * -0.5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,1);
  *pdVar5 = dVar10 * 0.5 * dVar11;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,1);
  *pdVar5 = dVar6 * -0.5 * dVar11;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,2,1);
  *pdVar5 = dVar2 * -0.5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,2);
  *pdVar5 = dVar8 * 0.5 * dVar11;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,2);
  *pdVar5 = dVar6 * 0.5 * dVar11;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,2,2);
  *pdVar5 = dVar3 * -0.5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,3);
  *pdVar5 = dVar8 * -0.5 * dVar11;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,3);
  *pdVar5 = dVar11 * dVar9 * 0.5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,2,3);
  *pdVar5 = dVar4 * -0.5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,4);
  *pdVar5 = dVar10 * -0.5 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,4);
  *pdVar5 = dVar9 * -0.5 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,2,4);
  *pdVar5 = dVar1 * 0.5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,5);
  *pdVar5 = dVar10 * 0.5 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,5);
  *pdVar5 = dVar6 * -0.5 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,2,5);
  *pdVar5 = dVar2 * 0.5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,6);
  *pdVar5 = dVar8 * 0.5 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,6);
  *pdVar5 = dVar6 * 0.5 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,2,6);
  *pdVar5 = dVar3 * 0.5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,7);
  *pdVar5 = dVar8 * -0.5 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,1,7);
  *pdVar5 = dVar9 * 0.5 * dVar7;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,2,7);
  *pdVar5 = dVar4 * 0.5;
  return;
}

Assistant:

void TPZShapeCube::ShapeCorner(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
{
		
		REAL x[2],dx[2],y[2],dy[2],z[2],dz[2];
		x[0]  = (1.-pt[0])/2.;
		x[1]  = (1.+pt[0])/2.;
		dx[0] = -0.5;
		dx[1] =  0.5;
		y[0]  = (1.-pt[1])/2.;
		y[1]  = (1.+pt[1])/2.;
		dy[0] = -0.5;
		dy[1] =  0.5;
		z[0]  = (1.-pt[2])/2.;
		z[1]  = (1.+pt[2])/2.;
		dz[0] = -0.5;
		dz[1] =  0.5;
		
		phi(0,0)  = x[0]*y[0]*z[0];
		phi(1,0)  = x[1]*y[0]*z[0];
		phi(2,0)  = x[1]*y[1]*z[0];
		phi(3,0)  = x[0]*y[1]*z[0];
		phi(4,0)  = x[0]*y[0]*z[1];
		phi(5,0)  = x[1]*y[0]*z[1];
		phi(6,0)  = x[1]*y[1]*z[1];
		phi(7,0)  = x[0]*y[1]*z[1];
		dphi(0,0) = dx[0]*y[0]*z[0];
		dphi(1,0) = x[0]*dy[0]*z[0];
		dphi(2,0) = x[0]*y[0]*dz[0];
		dphi(0,1) = dx[1]*y[0]*z[0];
		dphi(1,1) = x[1]*dy[0]*z[0];
		dphi(2,1) = x[1]*y[0]*dz[0];
		dphi(0,2) = dx[1]*y[1]*z[0];
		dphi(1,2) = x[1]*dy[1]*z[0];
		dphi(2,2) = x[1]*y[1]*dz[0];
		dphi(0,3) = dx[0]*y[1]*z[0];
		dphi(1,3) = x[0]*dy[1]*z[0];
		dphi(2,3) = x[0]*y[1]*dz[0];
		dphi(0,4) = dx[0]*y[0]*z[1];
		dphi(1,4) = x[0]*dy[0]*z[1];
		dphi(2,4) = x[0]*y[0]*dz[1];
		dphi(0,5) = dx[1]*y[0]*z[1];
		dphi(1,5) = x[1]*dy[0]*z[1];
		dphi(2,5) = x[1]*y[0]*dz[1];
		dphi(0,6) = dx[1]*y[1]*z[1];
		dphi(1,6) = x[1]*dy[1]*z[1];
		dphi(2,6) = x[1]*y[1]*dz[1];
		dphi(0,7) = dx[0]*y[1]*z[1];
		dphi(1,7) = x[0]*dy[1]*z[1];
		dphi(2,7) = x[0]*y[1]*dz[1];
	}